

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_reseed_internal
              (mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len,size_t nonce_len)

{
  int iVar1;
  int local_1c4;
  size_t sStack_1c0;
  int ret;
  size_t seedlen;
  uchar seed [384];
  size_t nonce_len_local;
  size_t len_local;
  uchar *additional_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  if (ctx->entropy_len < 0x181) {
    if (0x180 - ctx->entropy_len < nonce_len) {
      ctx_local._4_4_ = -0x38;
    }
    else if ((0x180 - ctx->entropy_len) - nonce_len < len) {
      ctx_local._4_4_ = -0x38;
    }
    else {
      memset(&seedlen,0,0x180);
      iVar1 = (*ctx->f_entropy)(ctx->p_entropy,(uchar *)&seedlen,ctx->entropy_len);
      if (iVar1 == 0) {
        sStack_1c0 = ctx->entropy_len;
        if (nonce_len != 0) {
          iVar1 = (*ctx->f_entropy)(ctx->p_entropy,(uchar *)&seedlen,nonce_len);
          if (iVar1 != 0) {
            return -0x34;
          }
          sStack_1c0 = nonce_len + sStack_1c0;
        }
        if ((additional != (uchar *)0x0) && (len != 0)) {
          memcpy(seed + (sStack_1c0 - 8),additional,len);
          sStack_1c0 = len + sStack_1c0;
        }
        local_1c4 = block_cipher_df((uchar *)&seedlen,(uchar *)&seedlen,sStack_1c0);
        if ((local_1c4 == 0) &&
           (local_1c4 = ctr_drbg_update_internal(ctx,(uchar *)&seedlen), local_1c4 == 0)) {
          ctx->reseed_counter = 1;
        }
        mbedtls_platform_zeroize(&seedlen,0x180);
        ctx_local._4_4_ = local_1c4;
      }
      else {
        ctx_local._4_4_ = -0x34;
      }
    }
  }
  else {
    ctx_local._4_4_ = -0x38;
  }
  return ctx_local._4_4_;
}

Assistant:

static int mbedtls_ctr_drbg_reseed_internal( mbedtls_ctr_drbg_context *ctx,
                                             const unsigned char *additional,
                                             size_t len,
                                             size_t nonce_len )
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( ctx->entropy_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );
    if( nonce_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );
    if( len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT - ctx->entropy_len - nonce_len )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT );

    /* Gather entropy_len bytes of entropy to seed state. */
    if( 0 != ctx->f_entropy( ctx->p_entropy, seed, ctx->entropy_len ) )
    {
        return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
    }
    seedlen += ctx->entropy_len;

    /* Gather entropy for a nonce if requested. */
    if( nonce_len != 0 )
    {
        if( 0 != ctx->f_entropy( ctx->p_entropy, seed, nonce_len ) )
        {
            return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
        }
        seedlen += nonce_len;
    }

    /* Add additional data if provided. */
    if( additional != NULL && len != 0 )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /* Reduce to 384 bits. */
    if( ( ret = block_cipher_df( seed, seed, seedlen ) ) != 0 )
        goto exit;

    /* Update state. */
    if( ( ret = ctr_drbg_update_internal( ctx, seed ) ) != 0 )
        goto exit;
    ctx->reseed_counter = 1;

exit:
    mbedtls_platform_zeroize( seed, sizeof( seed ) );
    return( ret );
}